

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int main(int argc,char **argv)

{
  sigaction signal_action;
  Arguments args;
  Arguments *in_stack_ffffffffffffff48;
  sigaction *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Arguments *in_stack_ffffffffffffff60;
  
  parse_arguments(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                  (char **)in_stack_ffffffffffffff50);
  setup_client_signals((sigaction *)0x1022ec);
  communicate(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	// For command-line arguments
	struct Arguments args;
	struct sigaction signal_action;

	parse_arguments(&args, argc, argv);
	setup_client_signals(&signal_action);

	communicate(&signal_action, &args);
}